

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::verifyProgram
               (NegativeTestContext *ctx,ProgramSources *sources,ExpectResult expect)

{
  ostringstream *this;
  TestLog *log;
  string message;
  ShaderProgram program;
  string local_290;
  ShaderProgram local_270;
  undefined1 local_1a0 [384];
  
  log = (ctx->super_CallLogWrapper).m_log;
  glu::ShaderProgram::ShaderProgram(&local_270,ctx->m_renderCtx,sources);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_290._M_string_length = 0;
  local_290.field_2._M_local_buf[0] = '\0';
  glu::operator<<(log,&local_270);
  std::__cxx11::string::assign((char *)&local_290);
  if (local_270.m_program.m_info.linkOk != false) {
    this = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,(string *)&local_290);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    NegativeTestContext::fail(ctx,&local_290);
  }
  std::__cxx11::string::~string((string *)&local_290);
  glu::ShaderProgram::~ShaderProgram(&local_270);
  return;
}

Assistant:

void verifyProgram(NegativeTestContext& ctx, glu::ProgramSources sources, ExpectResult expect)
{
	DE_ASSERT(expect >= EXPECT_RESULT_PASS && expect < EXPECT_RESULT_LAST);

	tcu::TestLog&				log			= ctx.getLog();
	const glu::ShaderProgram	program		(ctx.getRenderContext(), sources);
	bool						testFailed	= false;
	std::string					message;

	log << program;

	if (expect == EXPECT_RESULT_PASS)
	{
		testFailed = !program.getProgramInfo().linkOk;
		message = "Program did not link.";
	}
	else
	{
		testFailed = program.getProgramInfo().linkOk;
		message = "Program was not expected to link.";
	}

	if (testFailed)
	{
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		ctx.fail(message);
	}
}